

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O3

benchmark * __thiscall
picobench::registry::add_benchmark(registry *this,char *name,benchmark_proc proc)

{
  iterator __position;
  benchmark_impl *pbVar1;
  vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
  *this_00;
  benchmark_impl *b;
  _Head_base<0UL,_picobench::benchmark_impl_*,_false> local_28;
  
  pbVar1 = (benchmark_impl *)operator_new(0x60);
  (pbVar1->super_benchmark)._name = name;
  (pbVar1->super_benchmark)._proc = proc;
  (pbVar1->super_benchmark)._baseline = false;
  (pbVar1->super_benchmark)._user_data = 0;
  *(undefined8 *)
   &(pbVar1->super_benchmark)._state_iterations.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl = 0;
  *(pointer *)((long)&(pbVar1->super_benchmark)._state_iterations + 8) = (pointer)0x0;
  *(pointer *)((long)&(pbVar1->super_benchmark)._state_iterations + 0x10) = (pointer)0x0;
  (pbVar1->super_benchmark)._samples = 0;
  *(undefined8 *)
   &(pbVar1->_states).super__Vector_base<picobench::state,_std::allocator<picobench::state>_>.
    _M_impl = 0;
  *(pointer *)
   ((long)&(pbVar1->_states).super__Vector_base<picobench::state,_std::allocator<picobench::state>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pbVar1->_states).super__Vector_base<picobench::state,_std::allocator<picobench::state>_>
   + 0x10) = (pointer)0x0;
  (pbVar1->_istate)._M_current = (state *)0x0;
  local_28._M_head_impl = pbVar1;
  this_00 = (vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
             *)benchmarks_for_current_suite(this);
  __position._M_current =
       *(unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> **)
        (this_00 + 8);
  if (__position._M_current ==
      *(unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> **)
       (this_00 + 0x10)) {
    std::
    vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
    ::_M_realloc_insert<picobench::benchmark_impl*&>(this_00,__position,&local_28._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
    .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl = pbVar1;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    local_28._M_head_impl = pbVar1;
  }
  return &(local_28._M_head_impl)->super_benchmark;
}

Assistant:

benchmark& add_benchmark(const char* name, benchmark_proc proc)
    {
        auto b = new benchmark_impl(name, proc);
        benchmarks_for_current_suite().emplace_back(b);
        return *b;
    }